

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailbox_safe.cpp
# Opt level: O0

void __thiscall zmq::mailbox_safe_t::mailbox_safe_t(mailbox_safe_t *this,mutex_t *sync_)

{
  bool bVar1;
  _func_int **in_RSI;
  i_mailbox *in_RDI;
  bool ok;
  ypipe_t<zmq::command_t,_16> *this_00;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  i_mailbox::i_mailbox(in_RDI);
  in_RDI->_vptr_i_mailbox = (_func_int **)&PTR__mailbox_safe_t_003e8f10;
  ypipe_t<zmq::command_t,_16>::ypipe_t
            ((ypipe_t<zmq::command_t,_16> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  condition_variable_t::condition_variable_t((condition_variable_t *)0x2f8963);
  in_RDI[0x15]._vptr_i_mailbox = in_RSI;
  this_00 = (ypipe_t<zmq::command_t,_16> *)(in_RDI + 0x16);
  std::vector<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_>::vector
            ((vector<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_> *)0x2f8987);
  bVar1 = ypipe_t<zmq::command_t,_16>::check_read(this_00);
  if (bVar1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!ok",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/mailbox_safe.cpp"
            ,0x2b);
    fflush(_stderr);
    zmq_abort((char *)0x2f8a02);
  }
  return;
}

Assistant:

zmq::mailbox_safe_t::mailbox_safe_t (mutex_t *sync_) : _sync (sync_)
{
    //  Get the pipe into passive state. That way, if the users starts by
    //  polling on the associated file descriptor it will get woken up when
    //  new command is posted.
    const bool ok = _cpipe.check_read ();
    zmq_assert (!ok);
}